

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::uadd_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  APInt AVar2;
  APInt local_30;
  
  APInt(&local_30,RHS);
  operator+((llvm *)this,&local_30,(APInt *)Overflow);
  ~APInt(&local_30);
  bVar1 = ult(this,(APInt *)Overflow);
  *(bool *)in_RCX = bVar1;
  AVar2._8_8_ = extraout_RDX;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::uadd_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this+RHS;
  Overflow = Res.ult(RHS);
  return Res;
}